

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O0

void __thiscall EthernetLink::EthernetLink(EthernetLink *this,char *name)

{
  GEvent<EthernetLink> *in_RDI;
  int p;
  _Elt_pointer fun;
  EthernetLink *obj;
  char *in_stack_ffffffffffffffc8;
  Link *in_stack_ffffffffffffffd0;
  
  Link::Link(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  (in_RDI->super_Event)._vptr_Event = (_func_int **)&PTR__EthernetLink_00174568;
  p = (int)((ulong)&(in_RDI->super_Event)._particles.
                    super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 0x20);
  fun = (_Elt_pointer)0x0;
  (in_RDI->super_Event)._particles.
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (in_RDI->super_Event)._particles.
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (in_RDI->super_Event)._particles.
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  std::vector<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>::vector
            ((vector<EthernetInterface_*,_std::allocator<EthernetInterface_*>_> *)0x13e85f);
  obj = (EthernetLink *)
        &(in_RDI->super_Event)._particles.
         super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish;
  (in_RDI->super_Event)._particles.
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = fun;
  (in_RDI->super_Event)._particles.
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (in_RDI->super_Event)._particles.
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  std::vector<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>::vector
            ((vector<EthernetInterface_*,_std::allocator<EthernetInterface_*>_> *)0x13e886);
  *(undefined1 *)
   &(in_RDI->super_Event)._particles.
    super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = 0;
  *(undefined1 *)
   ((long)&(in_RDI->super_Event)._particles.
           super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node + 1) = 0;
  *(undefined1 *)
   ((long)&(in_RDI->super_Event)._particles.
           super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node + 2) = 0;
  *(undefined4 *)
   ((long)&(in_RDI->super_Event)._particles.
           super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node + 4) = 10;
  (in_RDI->super_Event)._time.v = 0;
  MetaSim::GEvent<EthernetLink>::GEvent(in_RDI,obj,(Pmemfun)fun,p);
  MetaSim::GEvent<EthernetLink>::GEvent(in_RDI,obj,(Pmemfun)fun,p);
  MetaSim::GEvent<EthernetLink>::GEvent(in_RDI,obj,(Pmemfun)fun,p);
  return;
}

Assistant:

EthernetLink::EthernetLink(const char *name) 
    : Link(name), _interfaces(), _contending(), 
      _isBusy(false),
      _isContending(false),
      _isCollision(false),
      _contention_period(10),
      _message(0),
      _end_contention_evt(this, &EthernetLink::onEndContention),
      _collision_evt(this, &EthernetLink::onCollision),
      _end_transmission_evt(this, &EthernetLink::onEndTransmission)
{
    //register_handler(_end_contention_evt, this, &EthernetLink::onEndContention);
    //register_handler(_collision_evt, this, &EthernetLink::onCollision);
    //register_handler(_end_transmission_evt, this, &EthernetLink::onEndTransmission);
}